

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbiw__zlib_flushf(uchar *data,uint *bitbuffer,int *bitcount)

{
  uint uVar1;
  int iVar2;
  int *in_RDX;
  uint *in_RSI;
  uchar *in_RDI;
  
  while( true ) {
    if (*in_RDX < 8) break;
    if ((in_RDI == (uchar *)0x0) || (*(int *)(in_RDI + -8) <= *(int *)(in_RDI + -4) + 1)) {
      stbiw__sbgrowf((void **)data,bitbuffer._4_4_,(int)bitbuffer);
    }
    uVar1 = *in_RSI;
    iVar2 = *(int *)(in_RDI + -4);
    *(int *)(in_RDI + -4) = iVar2 + 1;
    in_RDI[iVar2] = (uchar)uVar1;
    *in_RSI = *in_RSI >> 8;
    *in_RDX = *in_RDX + -8;
  }
  return in_RDI;
}

Assistant:

static unsigned char *stbiw__zlib_flushf(unsigned char *data, unsigned int *bitbuffer, int *bitcount)
{
   while (*bitcount >= 8) {
      stbiw__sbpush(data, STBIW_UCHAR(*bitbuffer));
      *bitbuffer >>= 8;
      *bitcount -= 8;
   }
   return data;
}